

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_print.c
# Opt level: O3

print_output get_env_printmode(void)

{
  int iVar1;
  print_output pVar2;
  char *__s1;
  
  __s1 = getenv("CK_VERBOSITY");
  if (__s1 == (char *)0x0) {
    pVar2 = CK_NORMAL;
  }
  else {
    iVar1 = strcmp(__s1,"silent");
    if (iVar1 == 0) {
      pVar2 = CK_SILENT;
    }
    else {
      iVar1 = strcmp(__s1,"minimal");
      if (iVar1 == 0) {
        pVar2 = CK_MINIMAL;
      }
      else {
        iVar1 = strcmp(__s1,"verbose");
        pVar2 = (iVar1 == 0) + CK_NORMAL;
      }
    }
  }
  return pVar2;
}

Assistant:

enum print_output get_env_printmode(void)
{
    char *env = getenv("CK_VERBOSITY");

    if(env == NULL)
        return CK_NORMAL;
    if(strcmp(env, "silent") == 0)
        return CK_SILENT;
    if(strcmp(env, "minimal") == 0)
        return CK_MINIMAL;
    if(strcmp(env, "verbose") == 0)
        return CK_VERBOSE;
    return CK_NORMAL;
}